

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::QuadMeshNode> *mesh,ssize_t id)

{
  MaterialNode *pMVar1;
  avector<Vec3fa> *paVar2;
  int __oflag;
  int __oflag_00;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  avector<Vec3fa> *paVar3;
  Ref<embree::SceneGraph::MaterialNode> local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"QuadMesh","");
  open(this,(char *)local_48,(int)id);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  pMVar1 = (mesh->ptr->material).ptr;
  local_f0.ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])(pMVar1);
  }
  store(this,&local_f0);
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[3])(pMVar1);
  }
  if ((long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"animated_positions","");
    open(this,(char *)local_68,__oflag);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  paVar2 = (mesh->ptr->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar3 = (mesh->ptr->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar3 != paVar2; paVar3 = paVar3 + 1) {
    store(this,"positions",paVar3);
  }
  if ((long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"animated_positions","");
    close(this,(int)(string *)local_88);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
  }
  if ((long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"animated_normals","");
    open(this,(char *)local_a8,__oflag_00);
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0]);
    }
  }
  paVar2 = (mesh->ptr->normals).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar3 = (mesh->ptr->normals).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar3 != paVar2; paVar3 = paVar3 + 1) {
    store(this,"normals",paVar3);
  }
  if ((long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"animated_normals","");
    close(this,(int)(string *)local_c8);
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0]);
    }
  }
  store<embree::Vec2<float>>(this,"texcoords",&mesh->ptr->texcoords);
  store<embree::SceneGraph::QuadMeshNode::Quad>(this,"indices",&mesh->ptr->quads);
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"QuadMesh","");
  close(this,(int)(string *)local_e8);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::QuadMeshNode> mesh, ssize_t id) 
  {
    open("QuadMesh",id);
    store(mesh->material);
    
    if (mesh->numTimeSteps() != 1) open("animated_positions");
    for (const auto& p : mesh->positions) store("positions",p);
    if (mesh->numTimeSteps() != 1) close("animated_positions");

    if (mesh->numTimeSteps() != 1) open("animated_normals");
    for (const auto& p : mesh->normals) store("normals",p);
    if (mesh->numTimeSteps() != 1) close("animated_normals");
    
    store("texcoords",mesh->texcoords);
    store("indices",mesh->quads);
    close("QuadMesh");
  }